

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsPublication
helicsFederateRegisterPublication
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  pointer pcVar1;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view units_00;
  ValueFederate *pVVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  HelicsPublication pvVar5;
  string *psVar6;
  Publication *pPVar7;
  _Alloc_hider _Var8;
  string_view name;
  string_view type_00;
  _Head_base<0UL,_helics::PublicationObject_*,_false> local_78;
  __uniq_ptr_impl<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
  local_70;
  HelicsError *local_68;
  size_type local_60;
  ValueFederate *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  size_t local_40;
  char *pcStack_38;
  
  local_68 = err;
  getValueFedSharedPtr(&local_58,(HelicsError *)fed);
  pVVar3 = local_58;
  if (local_58 != (ValueFederate *)0x0) {
    if (((uint)type < 10) || (type == HELICS_DATA_TYPE_JSON)) {
      local_78._M_head_impl = (PublicationObject *)operator_new(0x20);
      ((local_78._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_78._M_head_impl)->pubPtr = (Publication *)0x0;
      *(undefined8 *)local_78._M_head_impl = 0;
      ((local_78._M_head_impl)->fedptr).
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_60 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var8 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (key != (char *)0x0) {
        local_60 = strlen(key);
        _Var8._M_p = key;
      }
      psVar6 = helics::typeNameStringRef_abi_cxx11_(type);
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      sVar2 = psVar6->_M_string_length;
      local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      pcStack_38 = (char *)gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (units != (char *)0x0) {
        local_40 = strlen(units);
        pcStack_38 = units;
      }
      units_00._M_str = pcStack_38;
      units_00._M_len = local_40;
      name._M_str = _Var8._M_p;
      name._M_len = local_60;
      type_00._M_str = pcVar1;
      type_00._M_len = sVar2;
      pPVar7 = helics::ValueFederate::registerPublication(pVVar3,name,type_00,units_00);
      p_Var4 = p_Stack_50;
      pVVar3 = local_58;
      *(Publication **)((long)local_78._M_head_impl + 0x18) = pPVar7;
      local_58 = (ValueFederate *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_78._M_head_impl + 0x10))->
             _M_pi;
      (((shared_ptr<helics::ValueFederate> *)((long)local_78._M_head_impl + 8))->
      super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pVVar3;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_78._M_head_impl + 0x10))->_M_pi =
           p_Var4;
      local_70._M_t.
      super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
      .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl =
           (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
           (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
           local_78;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        local_70._M_t.
        super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
        .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl =
             (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
             (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
             local_78._M_head_impl;
      }
      local_78._M_head_impl = (PublicationObject *)0x0;
      pvVar5 = anon_unknown.dwarf_7c49a::addPublication
                         (fed,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                               *)&local_70);
      if ((_Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
           )local_70._M_t.
            super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
            .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl !=
          (PublicationObject *)0x0) {
        std::default_delete<helics::PublicationObject>::operator()
                  ((default_delete<helics::PublicationObject> *)&local_70,
                   (PublicationObject *)
                   local_70._M_t.
                   super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
                   .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl);
      }
      local_70._M_t.
      super__Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
      .super__Head_base<0UL,_helics::PublicationObject_*,_false>._M_head_impl =
           (tuple<helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>)
           (_Tuple_impl<0UL,_helics::PublicationObject_*,_std::default_delete<helics::PublicationObject>_>
            )0x0;
      if (local_78._M_head_impl != (PublicationObject *)0x0) {
        std::default_delete<helics::PublicationObject>::operator()
                  ((default_delete<helics::PublicationObject> *)&local_78,local_78._M_head_impl);
      }
      goto LAB_001a3080;
    }
    if (type == HELICS_DATA_TYPE_RAW) {
      pvVar5 = helicsFederateRegisterTypePublication(fed,key,"raw",units,local_68);
      goto LAB_001a3080;
    }
    if (local_68 != (HelicsError *)0x0) {
      local_68->error_code = -4;
      local_68->message = "unrecognized type code";
    }
  }
  pvVar5 = (HelicsPublication)0x0;
LAB_001a3080:
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return pvVar5;
}

Assistant:

HelicsPublication
    helicsFederateRegisterPublication(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterTypePublication(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &(fedObj->registerPublication(AS_STRING_VIEW(key),
                                                    helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                    AS_STRING_VIEW(units)));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}